

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb-test.cpp
# Opt level: O0

uint32_t __thiscall cubeb_client::get_stream_output_latency(cubeb_client *this)

{
  int iVar1;
  int rv;
  uint32_t latency;
  uint in_stack_ffffffffffffffe8;
  uint32_t local_4;
  
  local_4 = 0;
  iVar1 = cubeb_stream_get_latency
                    ((cubeb_stream *)(ulong)in_stack_ffffffffffffffe8,(uint32_t *)0x104c54);
  if (iVar1 != 0) {
    fprintf(_stderr,"Could not get the latency of the stream\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t cubeb_client::get_stream_output_latency() const {
  uint32_t latency = 0;
  int rv = cubeb_stream_get_latency(stream, &latency);
  if (rv != CUBEB_OK) {
    fprintf(stderr, "Could not get the latency of the stream\n");
    return 0;
  }
  return latency;
}